

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::SolverParameter::SolverParameter(SolverParameter *this)

{
  SolverParameter *pSVar1;
  SolverParameter *this_local;
  
  google::protobuf::Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__SolverParameter_00d4dcb0;
  google::protobuf::internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  memset(&this->_has_bits_,0,8);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->test_net_);
  google::protobuf::RepeatedField<int>::RepeatedField(&this->test_iter_);
  google::protobuf::RepeatedPtrField<caffe::NetParameter>::RepeatedPtrField(&this->test_net_param_);
  google::protobuf::RepeatedPtrField<caffe::NetState>::RepeatedPtrField(&this->test_state_);
  google::protobuf::RepeatedField<int>::RepeatedField(&this->stepvalue_);
  pSVar1 = internal_default_instance();
  if (this != pSVar1) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

SolverParameter::SolverParameter()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.SolverParameter)
}